

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.cpp
# Opt level: O1

common_control_vector_data *
common_control_vector_load
          (common_control_vector_data *__return_storage_ptr__,
          vector<common_control_vector_load_info,_std::allocator<common_control_vector_load_info>_>
          *load_infos)

{
  pointer pfVar1;
  int iVar2;
  int iVar3;
  long lVar4;
  common_log *pcVar5;
  char *pcVar6;
  int *piVar7;
  ulong uVar8;
  undefined8 uVar9;
  ulong uVar10;
  ulong uVar11;
  long lVar12;
  pointer pcVar13;
  bool bVar14;
  common_control_vector_data cur;
  ggml_context *ctx;
  string name;
  int local_f0;
  vector<float,_std::allocator<float>_> local_e8;
  ulong local_d0;
  int local_c4;
  vector<float,_std::allocator<float>_> *local_c0;
  common_control_vector_data *local_b8;
  undefined8 local_b0;
  value_type_conflict6 local_a8;
  undefined4 uStack_a4;
  long local_98 [2];
  long local_88;
  value_type_conflict6 local_80;
  undefined4 uStack_7c;
  long local_70 [2];
  pointer local_60;
  char *local_58;
  long *local_50 [2];
  long local_40 [2];
  
  __return_storage_ptr__->n_embd = -1;
  local_c0 = &__return_storage_ptr__->data;
  (__return_storage_ptr__->data).super__Vector_base<float,_std::allocator<float>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->data).super__Vector_base<float,_std::allocator<float>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->data).super__Vector_base<float,_std::allocator<float>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pcVar13 = (load_infos->
            super__Vector_base<common_control_vector_load_info,_std::allocator<common_control_vector_load_info>_>
            )._M_impl.super__Vector_impl_data._M_start;
  local_60 = (load_infos->
             super__Vector_base<common_control_vector_load_info,_std::allocator<common_control_vector_load_info>_>
             )._M_impl.super__Vector_impl_data._M_finish;
  local_b8 = __return_storage_ptr__;
  if (pcVar13 != local_60) {
    do {
      local_f0 = -1;
      local_e8.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = (pointer)0x0;
      local_e8.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)0x0;
      local_e8.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_finish = (pointer)0x0;
      local_b0 = 0;
      lVar4 = gguf_init_from_file((pcVar13->fname)._M_dataplus._M_p,0,&local_b0);
      if (lVar4 == 0) {
        if (-1 < common_log_verbosity_thold) {
          pcVar5 = common_log_main();
          common_log_add(pcVar5,GGML_LOG_LEVEL_ERROR,
                         "%s: failed to load control vector file from %s\n",
                         "common_control_vector_load_one",(pcVar13->fname)._M_dataplus._M_p);
        }
      }
      else {
        local_d0 = gguf_get_n_tensors(lVar4);
        if (((uint)local_d0 == 0) && (-1 < common_log_verbosity_thold)) {
          pcVar5 = common_log_main();
          common_log_add(pcVar5,GGML_LOG_LEVEL_WARN,"%s: no direction tensors found in %s\n",
                         "common_control_vector_load_one",(pcVar13->fname)._M_dataplus._M_p);
        }
        local_88 = lVar4;
        if (0 < (int)(uint)local_d0) {
          local_d0 = (ulong)((uint)local_d0 & 0x7fffffff);
          uVar11 = 0;
          do {
            pcVar6 = (char *)gguf_get_tensor_name(local_88,uVar11);
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_a8,pcVar6,(allocator<char> *)&local_80);
            bVar14 = false;
            lVar4 = std::__cxx11::string::find((char)(string *)&local_a8,0x2e);
            if (lVar4 != -1) {
              std::__cxx11::string::substr((ulong)local_50,(ulong)&local_a8);
              iVar2 = std::__cxx11::string::compare((char *)local_50);
              bVar14 = iVar2 == 0;
              if (local_50[0] != local_40) {
                operator_delete(local_50[0],local_40[0] + 1);
              }
            }
            iVar2 = -1;
            __return_storage_ptr__ = local_b8;
            if (bVar14) {
              std::__cxx11::string::substr((ulong)&local_80,(ulong)&local_a8);
              pcVar6 = (char *)CONCAT44(uStack_7c,local_80);
              piVar7 = __errno_location();
              local_c4 = *piVar7;
              *piVar7 = 0;
              lVar4 = strtol(pcVar6,&local_58,10);
              __return_storage_ptr__ = local_b8;
              if (local_58 == pcVar6) {
                uVar9 = std::__throw_invalid_argument("stoi");
LAB_001fd19a:
                if ((long *)CONCAT44(uStack_a4,local_a8) != local_98) {
                  operator_delete((long *)CONCAT44(uStack_a4,local_a8),local_98[0] + 1);
                }
                if (local_e8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                    super__Vector_impl_data._M_start != (pointer)0x0) {
                  operator_delete(local_e8.super__Vector_base<float,_std::allocator<float>_>._M_impl
                                  .super__Vector_impl_data._M_start,
                                  (long)local_e8.super__Vector_base<float,_std::allocator<float>_>.
                                        _M_impl.super__Vector_impl_data._M_end_of_storage -
                                  (long)local_e8.super__Vector_base<float,_std::allocator<float>_>.
                                        _M_impl.super__Vector_impl_data._M_start);
                }
                pfVar1 = (local_c0->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
                         super__Vector_impl_data._M_start;
                if (pfVar1 != (pointer)0x0) {
                  operator_delete(pfVar1,(long)(local_b8->data).
                                               super__Vector_base<float,_std::allocator<float>_>.
                                               _M_impl.super__Vector_impl_data._M_end_of_storage -
                                         (long)pfVar1);
                }
                _Unwind_Resume(uVar9);
              }
              iVar2 = (int)lVar4;
              if ((iVar2 != lVar4) || (*piVar7 == 0x22)) {
                uVar9 = std::__throw_out_of_range("stoi");
                goto LAB_001fd19a;
              }
              if (*piVar7 == 0) {
                *piVar7 = local_c4;
              }
              if ((long *)CONCAT44(uStack_7c,local_80) != local_70) {
                operator_delete((long *)CONCAT44(uStack_7c,local_80),local_70[0] + 1);
              }
            }
            if (iVar2 < 0) {
              if (-1 < common_log_verbosity_thold) {
                pcVar5 = common_log_main();
                common_log_add(pcVar5,GGML_LOG_LEVEL_ERROR,
                               "%s: invalid/unparsable direction tensor layer index in %s\n",
                               "common_control_vector_load_one",(pcVar13->fname)._M_dataplus._M_p);
              }
LAB_001fcf8d:
              local_f0 = -1;
              if ((long *)CONCAT44(uStack_a4,local_a8) != local_98) {
                operator_delete((long *)CONCAT44(uStack_a4,local_a8),local_98[0] + 1);
              }
              break;
            }
            if (iVar2 == 0) {
              if (-1 < common_log_verbosity_thold) {
                pcVar5 = common_log_main();
                common_log_add(pcVar5,GGML_LOG_LEVEL_ERROR,
                               "%s: invalid (zero) direction tensor layer index in %s\n",
                               "common_control_vector_load_one",(pcVar13->fname)._M_dataplus._M_p);
              }
              goto LAB_001fcf8d;
            }
            piVar7 = (int *)ggml_get_tensor(local_b0,CONCAT44(uStack_a4,local_a8));
            if (*piVar7 != 0) {
              if (-1 < common_log_verbosity_thold) {
                pcVar5 = common_log_main();
                common_log_add(pcVar5,GGML_LOG_LEVEL_ERROR,
                               "%s: invalid (non-F32) direction tensor type in %s\n",
                               "common_control_vector_load_one",(pcVar13->fname)._M_dataplus._M_p);
              }
              goto LAB_001fcf8d;
            }
            iVar3 = ggml_n_dims(piVar7);
            if (iVar3 != 1) {
              if (-1 < common_log_verbosity_thold) {
                pcVar5 = common_log_main();
                common_log_add(pcVar5,GGML_LOG_LEVEL_ERROR,
                               "%s: invalid (non-1D) direction tensor shape in %s\n",
                               "common_control_vector_load_one",(pcVar13->fname)._M_dataplus._M_p);
              }
              goto LAB_001fcf8d;
            }
            if (local_f0 == -1) {
              local_f0 = ggml_nelements(piVar7);
            }
            else {
              lVar4 = ggml_nelements(piVar7);
              if (lVar4 != local_f0) {
                if (-1 < common_log_verbosity_thold) {
                  pcVar5 = common_log_main();
                  common_log_add(pcVar5,GGML_LOG_LEVEL_ERROR,
                                 "%s: direction tensor in %s does not match previous dimensions\n",
                                 "common_control_vector_load_one",(pcVar13->fname)._M_dataplus._M_p)
                  ;
                }
                goto LAB_001fcf8d;
              }
            }
            uVar8 = (long)local_e8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_finish -
                    (long)local_e8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_start >> 2;
            uVar10 = (long)iVar2 * (long)local_f0;
            if ((ulong)((long)iVar2 * (long)local_f0) < uVar8) {
              uVar10 = uVar8;
            }
            local_80 = 0.0;
            std::vector<float,_std::allocator<float>_>::resize(&local_e8,uVar10,&local_80);
            if (0 < (long)local_f0) {
              lVar4 = *(long *)(piVar7 + 0x3e);
              iVar2 = (iVar2 + -1) * local_f0;
              lVar12 = 0;
              do {
                local_e8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                super__Vector_impl_data._M_start[iVar2 + lVar12] =
                     *(float *)(lVar4 + lVar12 * 4) * pcVar13->strength +
                     local_e8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                     super__Vector_impl_data._M_start[iVar2 + lVar12];
                lVar12 = lVar12 + 1;
              } while (local_f0 != lVar12);
            }
            if ((long *)CONCAT44(uStack_a4,local_a8) != local_98) {
              operator_delete((long *)CONCAT44(uStack_a4,local_a8),local_98[0] + 1);
            }
            uVar11 = uVar11 + 1;
          } while (uVar11 != local_d0);
        }
        lVar4 = local_88;
        if (local_f0 == -1) {
          if (-1 < common_log_verbosity_thold) {
            pcVar5 = common_log_main();
            common_log_add(pcVar5,GGML_LOG_LEVEL_WARN,
                           "%s: skipping %s due to invalid direction tensors\n",
                           "common_control_vector_load_one",(pcVar13->fname)._M_dataplus._M_p);
          }
          if (local_e8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
              super__Vector_impl_data._M_finish !=
              local_e8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
              super__Vector_impl_data._M_start) {
            local_e8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_finish =
                 local_e8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                 super__Vector_impl_data._M_start;
          }
        }
        gguf_free(lVar4);
        ggml_free(local_b0);
      }
      if (local_f0 == -1) {
LAB_001fd123:
        __return_storage_ptr__->n_embd = -1;
        if (local_e8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_e8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_start,
                          (long)local_e8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                                super__Vector_impl_data._M_end_of_storage -
                          (long)local_e8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                                super__Vector_impl_data._M_start);
        }
        break;
      }
      iVar2 = __return_storage_ptr__->n_embd;
      if (iVar2 != local_f0 && iVar2 != -1) {
        if (-1 < common_log_verbosity_thold) {
          pcVar5 = common_log_main();
          common_log_add(pcVar5,GGML_LOG_LEVEL_ERROR,
                         "%s: control vectors in %s does not match previous dimensions\n",
                         "common_control_vector_load",(pcVar13->fname)._M_dataplus._M_p);
        }
        goto LAB_001fd123;
      }
      if (iVar2 == -1) {
        __return_storage_ptr__->n_embd = local_f0;
        std::vector<float,_std::allocator<float>_>::_M_move_assign(local_c0);
      }
      else {
        uVar10 = (long)(__return_storage_ptr__->data).
                       super__Vector_base<float,_std::allocator<float>_>._M_impl.
                       super__Vector_impl_data._M_finish -
                 (long)(__return_storage_ptr__->data).
                       super__Vector_base<float,_std::allocator<float>_>._M_impl.
                       super__Vector_impl_data._M_start >> 2;
        uVar11 = (long)local_e8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                       super__Vector_impl_data._M_finish -
                 (long)local_e8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                       super__Vector_impl_data._M_start >> 2;
        if (uVar11 < uVar10) {
          uVar11 = uVar10;
        }
        local_a8 = 0.0;
        std::vector<float,_std::allocator<float>_>::resize(local_c0,uVar11,&local_a8);
        if ((long)local_e8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                  super__Vector_impl_data._M_finish -
            (long)local_e8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                  super__Vector_impl_data._M_start != 0) {
          lVar4 = (long)local_e8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                        super__Vector_impl_data._M_finish -
                  (long)local_e8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                        super__Vector_impl_data._M_start >> 2;
          pfVar1 = (local_c0->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
                   super__Vector_impl_data._M_start;
          lVar12 = 0;
          do {
            pfVar1[lVar12] =
                 local_e8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                 super__Vector_impl_data._M_start[lVar12] + pfVar1[lVar12];
            lVar12 = lVar12 + 1;
          } while (lVar4 + (ulong)(lVar4 == 0) != lVar12);
        }
      }
      if (local_e8.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data
          ._M_start != (pointer)0x0) {
        operator_delete(local_e8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_e8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage -
                        (long)local_e8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                              super__Vector_impl_data._M_start);
      }
      pcVar13 = pcVar13 + 1;
    } while (pcVar13 != local_60);
  }
  if (__return_storage_ptr__->n_embd == -1) {
    if (-1 < common_log_verbosity_thold) {
      pcVar5 = common_log_main();
      common_log_add(pcVar5,GGML_LOG_LEVEL_ERROR,"%s: no valid control vector files passed\n",
                     "common_control_vector_load");
    }
    pfVar1 = (__return_storage_ptr__->data).super__Vector_base<float,_std::allocator<float>_>.
             _M_impl.super__Vector_impl_data._M_start;
    if ((__return_storage_ptr__->data).super__Vector_base<float,_std::allocator<float>_>._M_impl.
        super__Vector_impl_data._M_finish != pfVar1) {
      (__return_storage_ptr__->data).super__Vector_base<float,_std::allocator<float>_>._M_impl.
      super__Vector_impl_data._M_finish = pfVar1;
    }
  }
  return __return_storage_ptr__;
}

Assistant:

common_control_vector_data common_control_vector_load(const std::vector<common_control_vector_load_info> & load_infos) {
    common_control_vector_data result = { -1, {} };

    for (const auto & info : load_infos) {
        auto cur = common_control_vector_load_one(info);

        if (cur.n_embd == -1) {
            result.n_embd = -1;
            break;
        }
        if (result.n_embd != -1 && result.n_embd != cur.n_embd) {
            LOG_ERR("%s: control vectors in %s does not match previous dimensions\n", __func__, info.fname.c_str());
            result.n_embd = -1;
            break;
        }

        if (result.n_embd == -1) {
            result = std::move(cur);
        } else {
            result.data.resize(std::max(result.data.size(), cur.data.size()), 0.0f);  // extend if necessary
            for (size_t i = 0; i < cur.data.size(); i++) {
                result.data[i] += cur.data[i];
            }
        }
    }

    if (result.n_embd == -1) {
        LOG_ERR("%s: no valid control vector files passed\n", __func__);
        result.data.clear();
    }

    return result;
}